

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TicketSystem.cpp
# Opt level: O0

int main(void)

{
  UserManager *pUVar1;
  TrainManager *pTVar2;
  OrderManager *pOVar3;
  char *pcVar4;
  string *argv;
  string *psVar5;
  ulong uVar6;
  ulong uVar7;
  void *this;
  ostream *this_00;
  string *this_01;
  bool bVar8;
  string ord;
  string tmp;
  OrderManager *order_manager;
  TrainManager *train_manager;
  UserManager *user_manager;
  int r;
  int l;
  int argc;
  string *in_stack_000005a0;
  int in_stack_000005ac;
  TrainManager *in_stack_000005b0;
  char *in_stack_fffffffffffff1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff1f0;
  TrainManager *in_stack_fffffffffffff210;
  int in_stack_fffffffffffff27c;
  UserManager *this_02;
  string *local_d50;
  int local_d44;
  string local_d40 [32];
  string *in_stack_fffffffffffff2e0;
  int in_stack_fffffffffffff2ec;
  UserManager *in_stack_fffffffffffff2f0;
  string *in_stack_fffffffffffff300;
  int in_stack_fffffffffffff30c;
  TrainManager *in_stack_fffffffffffff310;
  UserManager local_ce0;
  OrderManager *local_cb0;
  TrainManager *this_03;
  UserManager *this_04;
  undefined4 in_stack_fffffffffffff368;
  int in_stack_fffffffffffff36c;
  int iVar9;
  int iVar10;
  int iVar11;
  string local_c88 [4];
  int in_stack_fffffffffffff37c;
  TrainManager *in_stack_fffffffffffff380;
  int in_stack_fffffffffffff38c;
  UserManager *in_stack_fffffffffffff390;
  string *in_stack_fffffffffffff3f0;
  int in_stack_fffffffffffff3fc;
  TrainManager *in_stack_fffffffffffff400;
  UserManager *in_stack_fffffffffffff408;
  OrderManager *in_stack_fffffffffffff410;
  int in_stack_fffffffffffff41c;
  TrainManager *in_stack_fffffffffffff420;
  UserManager *in_stack_fffffffffffff428;
  OrderManager *in_stack_fffffffffffff430;
  string *in_stack_fffffffffffff440;
  int in_stack_fffffffffffff44c;
  UserManager *in_stack_fffffffffffff450;
  string *in_stack_fffffffffffff500;
  int in_stack_fffffffffffff50c;
  UserManager *in_stack_fffffffffffff510;
  string *in_stack_fffffffffffff640;
  int in_stack_fffffffffffff64c;
  TrainManager *in_stack_fffffffffffff650;
  string asStack_8 [4];
  int local_4;
  
  local_4 = 0;
  local_d50 = local_c88;
  do {
    std::__cxx11::string::string(local_d50);
    local_d50 = local_d50 + 0x20;
  } while (local_d50 != asStack_8);
  pUVar1 = (UserManager *)operator_new(0x20);
  sjtu::UserManager::UserManager((UserManager *)0x1047b6);
  pTVar2 = (TrainManager *)operator_new(0x28);
  sjtu::TrainManager::TrainManager((TrainManager *)0x1047e9);
  pOVar3 = (OrderManager *)operator_new(0x18);
  sjtu::OrderManager::OrderManager((OrderManager *)0x10481c);
  local_cb0 = pOVar3;
  do {
    this_02 = &local_ce0;
    std::__cxx11::string::string((string *)this_02);
    std::__cxx11::string::string((string *)&stack0xfffffffffffff300);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)this_02);
    this_03 = pTVar2;
    this_04 = pUVar1;
    while( true ) {
      pcVar4 = (char *)std::__cxx11::string::back();
      in_stack_fffffffffffff27c = CONCAT13(1,(int3)in_stack_fffffffffffff27c);
      if (*pcVar4 != '\r') {
        pcVar4 = (char *)std::__cxx11::string::back();
        in_stack_fffffffffffff27c = CONCAT13(*pcVar4 == '\n',(int3)in_stack_fffffffffffff27c);
      }
      if ((char)((uint)in_stack_fffffffffffff27c >> 0x18) == '\0') break;
      std::__cxx11::string::pop_back();
    }
    iVar11 = 0;
    iVar9 = 0;
    while( true ) {
      argv = (string *)(long)iVar9;
      psVar5 = (string *)std::__cxx11::string::length();
      iVar10 = iVar9;
      if (psVar5 <= argv) break;
      while( true ) {
        uVar6 = (ulong)iVar9;
        uVar7 = std::__cxx11::string::length();
        bVar8 = false;
        in_stack_fffffffffffff36c = iVar9;
        if (uVar6 < uVar7) {
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&local_ce0);
          bVar8 = *pcVar4 != ' ';
          in_stack_fffffffffffff36c = iVar9;
        }
        if (!bVar8) break;
        iVar9 = in_stack_fffffffffffff36c + 1;
      }
      if (iVar10 == 0) {
        std::__cxx11::string::string
                  (local_d40,(string *)&local_ce0,0,(long)in_stack_fffffffffffff36c);
        std::__cxx11::string::operator=((string *)&stack0xfffffffffffff300,local_d40);
        std::__cxx11::string::~string(local_d40);
      }
      else {
        std::__cxx11::string::string
                  ((string *)&stack0xfffffffffffff2e0,(string *)&local_ce0,(long)iVar10,
                   (long)(in_stack_fffffffffffff36c - iVar10));
        iVar9 = iVar11 + 1;
        std::__cxx11::string::operator=
                  (local_c88 + (long)iVar11 * 0x20,(string *)&stack0xfffffffffffff2e0);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffff2e0);
        iVar11 = iVar9;
      }
      iVar9 = in_stack_fffffffffffff36c + 1;
    }
    bVar8 = std::operator==(in_stack_fffffffffffff1f0,in_stack_fffffffffffff1e8);
    if (bVar8) {
      sjtu::UserManager::add_user
                (in_stack_fffffffffffff510,in_stack_fffffffffffff50c,in_stack_fffffffffffff500);
      pTVar2 = this_03;
      pUVar1 = this_04;
LAB_001050e6:
      local_d44 = 0;
    }
    else {
      bVar8 = std::operator==(in_stack_fffffffffffff1f0,in_stack_fffffffffffff1e8);
      if (bVar8) {
        sjtu::UserManager::login
                  (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e0);
        pTVar2 = this_03;
        pUVar1 = this_04;
        goto LAB_001050e6;
      }
      bVar8 = std::operator==(in_stack_fffffffffffff1f0,in_stack_fffffffffffff1e8);
      if (bVar8) {
        sjtu::UserManager::logout(this_02,in_stack_fffffffffffff27c,argv);
        pTVar2 = this_03;
        pUVar1 = this_04;
        goto LAB_001050e6;
      }
      bVar8 = std::operator==(in_stack_fffffffffffff1f0,in_stack_fffffffffffff1e8);
      if (bVar8) {
        sjtu::UserManager::query_profile
                  (in_stack_fffffffffffff390,in_stack_fffffffffffff38c,
                   (string *)in_stack_fffffffffffff380);
        pTVar2 = this_03;
        pUVar1 = this_04;
        goto LAB_001050e6;
      }
      bVar8 = std::operator==(in_stack_fffffffffffff1f0,in_stack_fffffffffffff1e8);
      if (bVar8) {
        sjtu::UserManager::modify_profile
                  (in_stack_fffffffffffff450,in_stack_fffffffffffff44c,in_stack_fffffffffffff440);
        pTVar2 = this_03;
        pUVar1 = this_04;
        goto LAB_001050e6;
      }
      bVar8 = std::operator==(in_stack_fffffffffffff1f0,in_stack_fffffffffffff1e8);
      if (bVar8) {
        sjtu::TrainManager::add_train
                  (in_stack_fffffffffffff650,in_stack_fffffffffffff64c,in_stack_fffffffffffff640);
        pTVar2 = this_03;
        pUVar1 = this_04;
        goto LAB_001050e6;
      }
      bVar8 = std::operator==(in_stack_fffffffffffff1f0,in_stack_fffffffffffff1e8);
      if (bVar8) {
        sjtu::TrainManager::release_train
                  (in_stack_fffffffffffff400,in_stack_fffffffffffff3fc,in_stack_fffffffffffff3f0);
        pTVar2 = this_03;
        pUVar1 = this_04;
        goto LAB_001050e6;
      }
      bVar8 = std::operator==(in_stack_fffffffffffff1f0,in_stack_fffffffffffff1e8);
      if (bVar8) {
        sjtu::TrainManager::query_train
                  (in_stack_fffffffffffff310,in_stack_fffffffffffff30c,in_stack_fffffffffffff300);
        pTVar2 = this_03;
        pUVar1 = this_04;
        goto LAB_001050e6;
      }
      bVar8 = std::operator==(in_stack_fffffffffffff1f0,in_stack_fffffffffffff1e8);
      if (bVar8) {
        sjtu::TrainManager::delete_train
                  (in_stack_fffffffffffff380,in_stack_fffffffffffff37c,
                   (string *)CONCAT44(iVar11,iVar9));
        pTVar2 = this_03;
        pUVar1 = this_04;
        goto LAB_001050e6;
      }
      bVar8 = std::operator==(in_stack_fffffffffffff1f0,in_stack_fffffffffffff1e8);
      if (bVar8) {
        sjtu::TrainManager::query_ticket(in_stack_000005b0,in_stack_000005ac,in_stack_000005a0);
        pTVar2 = this_03;
        pUVar1 = this_04;
        goto LAB_001050e6;
      }
      bVar8 = std::operator==(in_stack_fffffffffffff1f0,in_stack_fffffffffffff1e8);
      if (bVar8) {
        sjtu::TrainManager::query_transfer
                  (in_stack_fffffffffffff380,in_stack_fffffffffffff37c,
                   (string *)CONCAT44(iVar11,iVar9));
        pTVar2 = this_03;
        pUVar1 = this_04;
        goto LAB_001050e6;
      }
      bVar8 = std::operator==(in_stack_fffffffffffff1f0,in_stack_fffffffffffff1e8);
      if (bVar8) {
        sjtu::OrderManager::buy_ticket
                  (in_stack_fffffffffffff430,in_stack_fffffffffffff428,in_stack_fffffffffffff420,
                   in_stack_fffffffffffff41c,(string *)in_stack_fffffffffffff410);
        pTVar2 = this_03;
        pUVar1 = this_04;
        goto LAB_001050e6;
      }
      bVar8 = std::operator==(in_stack_fffffffffffff1f0,in_stack_fffffffffffff1e8);
      if (bVar8) {
        sjtu::UserManager::query_order
                  ((UserManager *)CONCAT44(iVar11,iVar9),
                   (OrderManager *)CONCAT44(in_stack_fffffffffffff36c,in_stack_fffffffffffff368),
                   (int)((ulong)this_04 >> 0x20),(string *)this_03);
        pTVar2 = this_03;
        pUVar1 = this_04;
        goto LAB_001050e6;
      }
      bVar8 = std::operator==(in_stack_fffffffffffff1f0,in_stack_fffffffffffff1e8);
      if (bVar8) {
        sjtu::OrderManager::refund_ticket
                  (in_stack_fffffffffffff410,in_stack_fffffffffffff408,in_stack_fffffffffffff400,
                   in_stack_fffffffffffff3fc,in_stack_fffffffffffff3f0);
        pTVar2 = this_03;
        pUVar1 = this_04;
        goto LAB_001050e6;
      }
      bVar8 = std::operator==(in_stack_fffffffffffff1f0,in_stack_fffffffffffff1e8);
      if (bVar8) {
        sjtu::UserManager::init(this_04,(EVP_PKEY_CTX *)0x1);
        sjtu::TrainManager::init(this_03,(EVP_PKEY_CTX *)0x1);
        sjtu::OrderManager::init(local_cb0,(EVP_PKEY_CTX *)0x1);
        this = (void *)std::ostream::operator<<(&std::cout,0);
        std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
        pTVar2 = this_03;
        pUVar1 = this_04;
        goto LAB_001050e6;
      }
      bVar8 = std::operator==(in_stack_fffffffffffff1f0,in_stack_fffffffffffff1e8);
      pTVar2 = this_03;
      pUVar1 = this_04;
      if (!bVar8) goto LAB_001050e6;
      if (this_04 != (UserManager *)0x0) {
        sjtu::UserManager::~UserManager((UserManager *)in_stack_fffffffffffff400);
        operator_delete(this_04,0x20);
      }
      pTVar2 = this_03;
      if (this_03 != (TrainManager *)0x0) {
        sjtu::TrainManager::~TrainManager(in_stack_fffffffffffff210);
        operator_delete(this_03,0x28);
      }
      if (local_cb0 != (OrderManager *)0x0) {
        pOVar3 = local_cb0;
        sjtu::OrderManager::~OrderManager(local_cb0);
        operator_delete(pOVar3,0x18);
      }
      this_00 = std::operator<<((ostream *)&std::cout,"bye");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      local_d44 = 3;
    }
    std::__cxx11::string::~string((string *)&stack0xfffffffffffff300);
    std::__cxx11::string::~string((string *)&local_ce0);
    if (local_d44 != 0) {
      local_4 = 0;
      this_01 = asStack_8;
      do {
        this_01 = this_01 + -0x20;
        std::__cxx11::string::~string(this_01);
      } while (this_01 != local_c88);
      return local_4;
    }
  } while( true );
}

Assistant:

int main()
{
	/*std::ifstream in("data/3.in");
	std::cin.rdbuf(in.rdbuf());
	std::ofstream out("3.out");
	std::cout.rdbuf(out.rdbuf());*/
    std::string argv[100];
    int argc = 0, l, r;
    sjtu::UserManager *user_manager;
    sjtu::TrainManager *train_manager;
    sjtu::OrderManager *order_manager;
    user_manager = new sjtu::UserManager;
    train_manager = new sjtu::TrainManager;
    order_manager = new sjtu::OrderManager;
    while(1) {
        std::string tmp, ord;
        for (getline(std::cin, tmp);tmp.back() == '\r' || tmp.back() == '\n';tmp.pop_back());
        argc = 0;
        for (l = 0; l < tmp.length(); l = r + 1) {
            for (r = l; r < tmp.length() && tmp[r] != ' '; ++r);
            if (l != 0) argv[argc++] = std::string(tmp, l, r - l);
            else ord = std::string(tmp, l, r - l);
        }
        if(ord == "add_user") user_manager->add_user(argc, argv);
        else if (ord == "login") user_manager->login(argc, argv);
        else if (ord == "logout") user_manager->logout(argc, argv);
        else if (ord == "query_profile") user_manager->query_profile(argc, argv);
        else if (ord == "modify_profile") user_manager->modify_profile(argc, argv);
        else if (ord == "add_train") train_manager->add_train(argc, argv);
        else if (ord == "release_train") train_manager->release_train(argc, argv);
        else if (ord == "query_train") train_manager->query_train(argc, argv);
        else if (ord == "delete_train") train_manager->delete_train(argc, argv);
        else if (ord == "query_ticket") train_manager->query_ticket(argc, argv);
        else if (ord == "query_transfer") train_manager->query_transfer(argc, argv);
        else if (ord == "buy_ticket") order_manager->buy_ticket(user_manager, train_manager, argc, argv);
        else if (ord == "query_order") user_manager->query_order(order_manager, argc, argv);
        else if (ord == "refund_ticket") order_manager->refund_ticket(user_manager, train_manager, argc, argv);
        else if (ord == "clean") {
            user_manager->init(true);
            train_manager->init(true);
            order_manager->init(true);
            std::cout << 0 << std::endl;
        }
        else if (ord == "exit") {
            delete user_manager;
            delete train_manager;
            delete order_manager;
            std::cout << "bye" << std::endl;
            break;
        }
    }
    return 0;
}